

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSidTreeNode.cpp
# Opt level: O3

SidTreeNode * __thiscall COLLADASaxFWL::SidTreeNode::findChildBySid(SidTreeNode *this,String *sid)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  SidIdentifier lowerBound;
  SidIdentifier local_38;
  
  local_38.hierarchyLevel = 0;
  p_Var4 = (this->mChildren)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var5 = &(this->mChildren)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var5->_M_header;
    local_38.sid = sid;
    do {
      bVar1 = SidIdentifier::operator<((SidIdentifier *)(p_Var4 + 1),&local_38);
      if (!bVar1) {
        p_Var3 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[bVar1];
    } while (p_Var4 != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var3 != p_Var5) {
      __n = (*(undefined8 **)(p_Var3 + 1))[1];
      if ((__n == sid->_M_string_length) &&
         ((__n == 0 ||
          (iVar2 = bcmp((void *)**(undefined8 **)(p_Var3 + 1),(sid->_M_dataplus)._M_p,__n),
          iVar2 == 0)))) {
        return (SidTreeNode *)p_Var3[1]._M_left;
      }
    }
  }
  return (SidTreeNode *)0x0;
}

Assistant:

SidTreeNode::SidTreeNode(const String& sid, SidTreeNode *parent)
		: mParent(parent)
		, mTargetType(TARGETTYPECLASS_UNKNOWN)
		, mSid(sid)
	{
		mTarget.object = 0;
	}